

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_NodeStoreEntry ** findSlot(UA_NodeStore *ns,UA_NodeId *nodeid)

{
  UA_UInt32 size_00;
  UA_Boolean UVar1;
  UA_UInt32 UVar2;
  UA_NodeStoreEntry *e;
  UA_UInt32 hash2;
  UA_UInt32 idx;
  UA_UInt32 size;
  UA_UInt32 h;
  UA_NodeId *nodeid_local;
  UA_NodeStore *ns_local;
  
  UVar2 = UA_NodeId_hash(nodeid);
  size_00 = ns->size;
  e._4_4_ = mod(UVar2,size_00);
  UVar2 = mod2(UVar2,size_00);
  while ((ns->entries[e._4_4_] < (UA_NodeStoreEntry *)0x2 ||
         (UVar1 = UA_NodeId_equal(&(ns->entries[e._4_4_]->node).nodeId,nodeid), !UVar1))) {
    if (ns->entries[e._4_4_] < (UA_NodeStoreEntry *)0x2) {
      return ns->entries + e._4_4_;
    }
    e._4_4_ = UVar2 + e._4_4_;
    if (size_00 <= e._4_4_) {
      e._4_4_ = e._4_4_ - size_00;
    }
  }
  return (UA_NodeStoreEntry **)0x0;
}

Assistant:

static UA_NodeStoreEntry **
findSlot(const UA_NodeStore *ns, const UA_NodeId *nodeid) {
    UA_UInt32 h = UA_NodeId_hash(nodeid);
    UA_UInt32 size = ns->size;
    UA_UInt32 idx = mod(h, size);
    UA_UInt32 hash2 = mod2(h, size);

    while(true) {
        UA_NodeStoreEntry *e = ns->entries[idx];
        if(e > UA_NODESTORE_TOMBSTONE &&
           UA_NodeId_equal(&e->node.nodeId, nodeid))
            return NULL;
        if(ns->entries[idx] <= UA_NODESTORE_TOMBSTONE)
            return &ns->entries[idx];
        idx += hash2;
        if(idx >= size)
            idx -= size;
    }

    /* NOTREACHED */
    return NULL;
}